

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O2

void F3DAudioCalculate(uint8_t *Instance,F3DAUDIO_LISTENER *pListener,F3DAUDIO_EMITTER *pEmitter,
                      uint32_t Flags,F3DAUDIO_DSP_SETTINGS *pDSPSettings)

{
  ConfigInfo *pCVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  uint uVar18;
  float *pMatrixCoefficients;
  F3DAUDIO_CONE *pFVar19;
  ConfigInfo *pCVar20;
  ulong uVar21;
  long lVar22;
  F3DAUDIO_DISTANCE_CURVE *pFVar23;
  ConfigInfo *curConfig;
  uint uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  F3DAUDIO_VECTOR channelPosition;
  F3DAUDIO_VECTOR channelPosition_00;
  float local_12c;
  F3DAUDIO_BASIS local_90;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar6 = (pListener->Position).x;
  uVar12 = (pListener->Position).y;
  uVar7 = (pEmitter->Position).x;
  uVar13 = (pEmitter->Position).y;
  fVar36 = (float)uVar6 - (float)uVar7;
  fVar37 = (float)uVar12 - (float)uVar13;
  fVar39 = (pListener->Position).z - (pEmitter->Position).z;
  fVar25 = (float)SDL_sqrtf(fVar39 * fVar39 + fVar36 * fVar36 + fVar37 * fVar37);
  pDSPSettings->EmitterToListenerDistance = fVar25;
  fVar26 = fVar25 / pEmitter->CurveDistanceScaler;
  if ((Flags & 1) != 0) {
    uVar24 = pDSPSettings->SrcChannelCount;
    uVar18 = pDSPSettings->DstChannelCount;
    pMatrixCoefficients = pDSPSettings->pMatrixCoefficients;
    lVar22 = 0xb;
    pCVar20 = (ConfigInfo *)0x12d9b8;
    do {
      lVar22 = lVar22 + -1;
      if (lVar22 == 0) {
        curConfig = (ConfigInfo *)0x0;
        break;
      }
      curConfig = pCVar20 + 1;
      pCVar1 = pCVar20 + 1;
      pCVar20 = curConfig;
    } while (pCVar1->configMask != *(uint32_t *)Instance);
    local_12c = ComputeDistanceAttenuation(fVar26,pEmitter->pVolumeCurve);
    fVar27 = ComputeDistanceAttenuation(fVar26,pEmitter->pLFECurve);
    if (pListener->pCone != (F3DAUDIO_CONE *)0x0) {
      fVar28 = (float)SDL_acosf(((pListener->OrientFront).z * fVar39 +
                                (pListener->OrientFront).x * fVar36 +
                                (pListener->OrientFront).y * fVar37) / fVar25);
      pFVar19 = pListener->pCone;
      fVar28 = ComputeConeParameter
                         (fVar25,-fVar28,pFVar19->InnerAngle,pFVar19->OuterAngle,
                          pFVar19->InnerVolume,pFVar19->OuterVolume);
      local_12c = local_12c * fVar28;
      fVar27 = fVar27 * fVar28;
    }
    if ((pEmitter->pCone != (F3DAUDIO_CONE *)0x0) && (pEmitter->ChannelCount == 1)) {
      fVar28 = (float)SDL_acosf(((pEmitter->OrientFront).z * fVar39 +
                                (pEmitter->OrientFront).x * fVar36 +
                                (pEmitter->OrientFront).y * fVar37) / fVar25);
      pFVar19 = pEmitter->pCone;
      fVar28 = ComputeConeParameter
                         (fVar25,fVar28,pFVar19->InnerAngle,pFVar19->OuterAngle,pFVar19->InnerVolume
                          ,pFVar19->OuterVolume);
      local_12c = local_12c * fVar28;
    }
    SDL_memset(pMatrixCoefficients,0,(ulong)uVar24 * (ulong)uVar18 * 4);
    if ((ulong)uVar18 == 1) {
      uVar24 = pEmitter->ChannelCount;
      for (uVar21 = 0; uVar24 != uVar21; uVar21 = uVar21 + 1) {
        if (((pEmitter->pChannelAzimuths == (float *)0x0) ||
            (fVar27 = pEmitter->pChannelAzimuths[uVar21], fVar27 != 6.2831855)) || (NAN(fVar27))) {
          pMatrixCoefficients[uVar21] = local_12c;
        }
      }
    }
    else {
      local_90.front.z = (pListener->OrientFront).z;
      local_90.front.x = (pListener->OrientFront).x;
      local_90.front.y = (pListener->OrientFront).y;
      fVar28 = (pListener->OrientFront).x;
      fVar40 = (pListener->OrientTop).x;
      uVar8 = (pListener->OrientTop).y;
      uVar14 = (pListener->OrientTop).z;
      uVar9 = (pListener->OrientFront).y;
      uVar15 = (pListener->OrientFront).z;
      local_90.right.z = fVar40 * (float)uVar9 - fVar28 * (float)uVar8;
      local_90.right.y = fVar28 * (float)uVar14 - fVar40 * (float)uVar15;
      local_90.right.x = (float)uVar15 * (float)uVar8 - (float)uVar14 * (float)uVar9;
      local_90.top.z = (pListener->OrientTop).z;
      local_90.top.x = (pListener->OrientTop).x;
      local_90.top.y = (pListener->OrientTop).y;
      uVar24 = pEmitter->ChannelCount;
      if (uVar24 == 1) {
        channelPosition.z = -fVar39;
        uVar21 = CONCAT44(fVar37,fVar36) ^ 0x8000000080000000;
        channelPosition.x = (float)(int)uVar21;
        channelPosition.y = (float)(int)(uVar21 >> 0x20);
        ComputeEmitterChannelCoefficients
                  (curConfig,&local_90,pEmitter->InnerRadius,channelPosition,local_12c,fVar27,Flags,
                   0,1,pMatrixCoefficients);
      }
      else {
        fVar28 = (pEmitter->OrientFront).x;
        fVar40 = (pEmitter->OrientTop).x;
        uVar10 = (pEmitter->OrientTop).y;
        uVar16 = (pEmitter->OrientTop).z;
        uVar11 = (pEmitter->OrientFront).y;
        uVar17 = (pEmitter->OrientFront).z;
        local_68 = (float)uVar17 * (float)uVar10 - (float)uVar16 * (float)uVar11;
        fStack_64 = fVar28 * (float)uVar16 - fVar40 * (float)uVar17;
        fStack_60 = (float)uVar17 * 0.0 - (float)uVar16 * 0.0;
        fStack_5c = (float)uVar17 * 0.0 - (float)uVar16 * 0.0;
        local_58 = ZEXT416((uint)(fVar40 * (float)uVar11 - fVar28 * (float)uVar10));
        for (uVar21 = 0; uVar21 < uVar24; uVar21 = uVar21 + 1) {
          if ((pEmitter->pChannelAzimuths[uVar21] != 6.2831855) ||
             (NAN(pEmitter->pChannelAzimuths[uVar21]))) {
            local_48 = ZEXT416((uint)(pEmitter->OrientFront).x);
            fVar28 = pEmitter->ChannelRadius;
            fVar29 = (float)SDL_cosf();
            SDL_cosf();
            SDL_cosf();
            fVar40 = pEmitter->ChannelRadius;
            fVar30 = (float)SDL_sinf();
            SDL_sinf();
            SDL_sinf();
            SDL_cosf();
            fVar2 = (pEmitter->OrientFront).y;
            fVar3 = pEmitter->ChannelRadius;
            fVar28 = fVar28 * (float)local_48._0_4_;
            fVar31 = (float)SDL_cosf();
            SDL_cosf();
            SDL_sinf();
            fVar40 = fVar40 * local_68;
            fVar38 = pEmitter->ChannelRadius * fStack_64;
            fVar32 = (float)SDL_sinf();
            SDL_sinf();
            SDL_cosf();
            SDL_cosf();
            fVar4 = (pEmitter->OrientFront).z;
            fVar5 = pEmitter->ChannelRadius;
            fVar33 = (float)SDL_cosf();
            SDL_sinf();
            SDL_sinf();
            fVar34 = pEmitter->ChannelRadius * (float)local_58._0_4_;
            fVar35 = (float)SDL_sinf();
            channelPosition_00.x = (fVar30 * fVar40 + fVar29 * fVar28) - fVar36;
            channelPosition_00.y = (fVar32 * fVar38 + fVar31 * fVar3 * fVar2) - fVar37;
            channelPosition_00.z = (fVar34 * fVar35 + fVar4 * fVar5 * fVar33) - fVar39;
            ComputeEmitterChannelCoefficients
                      (curConfig,&local_90,pEmitter->InnerRadius,channelPosition_00,local_12c,fVar27
                       ,Flags,(uint32_t)uVar21,pEmitter->ChannelCount,pMatrixCoefficients);
            uVar24 = pEmitter->ChannelCount;
          }
          else {
            pMatrixCoefficients[curConfig->LFSpeakerIdx * uVar24 + (uint32_t)uVar21] = fVar27;
          }
        }
      }
    }
  }
  if ((Flags & 4) != 0) {
    pFVar23 = &F3DAudioCalculate::lpfDirectDefault;
    if (pEmitter->pLPFDirectCurve != (F3DAUDIO_DISTANCE_CURVE *)0x0) {
      pFVar23 = pEmitter->pLPFDirectCurve;
    }
    fVar27 = ComputeDistanceAttenuation(fVar26,pFVar23);
    pDSPSettings->LPFDirectCoefficient = fVar27;
  }
  if ((Flags & 8) != 0) {
    pFVar23 = &F3DAudioCalculate::lpfReverbDefault;
    if (pEmitter->pLPFReverbCurve != (F3DAUDIO_DISTANCE_CURVE *)0x0) {
      pFVar23 = pEmitter->pLPFReverbCurve;
    }
    fVar27 = ComputeDistanceAttenuation(fVar26,pFVar23);
    pDSPSettings->LPFReverbCoefficient = fVar27;
  }
  if ((Flags & 0x10) != 0) {
    pFVar23 = &F3DAudioCalculate::reverbDefault;
    if (pEmitter->pReverbCurve != (F3DAUDIO_DISTANCE_CURVE *)0x0) {
      pFVar23 = pEmitter->pReverbCurve;
    }
    fVar26 = ComputeDistanceAttenuation(fVar26,pFVar23);
    pDSPSettings->ReverbLevel = fVar26;
  }
  if ((Flags & 0x20) != 0) {
    fVar26 = *(float *)(Instance + 0xc);
    pDSPSettings->DopplerFactor = 1.0;
    fVar27 = 0.0;
    if ((fVar25 != 0.0) || (NAN(fVar25))) {
      fVar27 = ((pListener->Velocity).z * fVar39 +
               (pListener->Velocity).x * fVar36 + (pListener->Velocity).y * fVar37) / fVar25;
      pDSPSettings->ListenerVelocityComponent = fVar27;
      fVar28 = ((pEmitter->Velocity).z * fVar39 +
               (pEmitter->Velocity).x * fVar36 + (pEmitter->Velocity).y * fVar37) / fVar25;
    }
    else {
      pDSPSettings->ListenerVelocityComponent = 0.0;
      fVar28 = 0.0;
    }
    pDSPSettings->EmitterVelocityComponent = fVar28;
    if (0.0 < pEmitter->DopplerScaler) {
      fVar40 = fVar26 / pEmitter->DopplerScaler;
      if (fVar40 <= fVar27) {
        fVar27 = fVar40;
      }
      pDSPSettings->ListenerVelocityComponent = fVar27;
      if (fVar40 <= fVar28) {
        fVar28 = fVar40;
      }
      pDSPSettings->EmitterVelocityComponent = fVar28;
      fVar26 = (fVar26 - fVar27 * pEmitter->DopplerScaler) /
               (fVar26 - fVar28 * pEmitter->DopplerScaler);
      uVar24 = -(uint)NAN(fVar26);
      fVar27 = (float)(uVar24 & 0x3f800000 | ~uVar24 & (uint)fVar26);
      fVar26 = 4.0;
      if ((fVar27 <= 4.0) && (fVar26 = 0.5, 0.5 <= fVar27)) {
        fVar26 = fVar27;
      }
      pDSPSettings->DopplerFactor = fVar26;
    }
  }
  if ((Flags & 0x40) != 0) {
    if (1.2e-07 <= fVar25) {
      fVar25 = (float)SDL_acosf((fVar39 * (pEmitter->OrientFront).z +
                                (pEmitter->OrientFront).x * fVar36 +
                                (pEmitter->OrientFront).y * fVar37) / fVar25);
    }
    else {
      fVar25 = 1.5707964;
    }
    pDSPSettings->EmitterToListenerAngle = fVar25;
  }
  if (((Flags & 2) != 0) && (*(int *)Instance == 3)) {
    uVar24 = pDSPSettings->DstChannelCount;
    for (uVar21 = 0; uVar24 != uVar21; uVar21 = uVar21 + 1) {
      pDSPSettings->pDelayTimes[uVar21] = 0.0;
    }
  }
  return;
}

Assistant:

void F3DAudioCalculate(
	const F3DAUDIO_HANDLE Instance,
	const F3DAUDIO_LISTENER *pListener,
	const F3DAUDIO_EMITTER *pEmitter,
	uint32_t Flags,
	F3DAUDIO_DSP_SETTINGS *pDSPSettings
) {
	uint32_t i;
	F3DAUDIO_VECTOR emitterToListener;
	float eToLDistance, normalizedDistance, dp;

	#define DEFAULT_POINTS(name, x1, y1, x2, y2) \
		static F3DAUDIO_DISTANCE_CURVE_POINT name##Points[2] = \
		{ \
			{ x1, y1 }, \
			{ x2, y2 } \
		}; \
		static F3DAUDIO_DISTANCE_CURVE name##Default = \
		{ \
			(F3DAUDIO_DISTANCE_CURVE_POINT*) &name##Points[0], 2 \
		};
	DEFAULT_POINTS(lpfDirect, 0.0f, 1.0f, 1.0f, 0.75f)
	DEFAULT_POINTS(lpfReverb, 0.0f, 0.75f, 1.0f, 0.75f)
	DEFAULT_POINTS(reverb, 0.0f, 1.0f, 1.0f, 0.0f)
	#undef DEFAULT_POINTS

	/* For XACT, this calculates "Distance" */
	emitterToListener = VectorSub(pListener->Position, pEmitter->Position);
	eToLDistance = VectorLength(emitterToListener);
	pDSPSettings->EmitterToListenerDistance = eToLDistance;

	F3DAudioCheckCalculateParams(Instance, pListener, pEmitter, Flags, pDSPSettings);

	/* This is used by MATRIX, LPF, and REVERB */
	normalizedDistance = eToLDistance / pEmitter->CurveDistanceScaler;

	if (Flags & F3DAUDIO_CALCULATE_MATRIX)
	{
		CalculateMatrix(
			SPEAKERMASK(Instance),
			Flags,
			pListener,
			pEmitter,
			pDSPSettings->SrcChannelCount,
			pDSPSettings->DstChannelCount,
			emitterToListener,
			eToLDistance,
			normalizedDistance,
			pDSPSettings->pMatrixCoefficients
		);
	}

	if (Flags & F3DAUDIO_CALCULATE_LPF_DIRECT)
	{
		pDSPSettings->LPFDirectCoefficient = ComputeDistanceAttenuation(
			normalizedDistance,
			(pEmitter->pLPFDirectCurve != NULL) ?
				pEmitter->pLPFDirectCurve :
				&lpfDirectDefault
		);
	}

	if (Flags & F3DAUDIO_CALCULATE_LPF_REVERB)
	{
		pDSPSettings->LPFReverbCoefficient = ComputeDistanceAttenuation(
			normalizedDistance,
			(pEmitter->pLPFReverbCurve != NULL) ?
				pEmitter->pLPFReverbCurve :
				&lpfReverbDefault
		);
	}

	if (Flags & F3DAUDIO_CALCULATE_REVERB)
	{
		pDSPSettings->ReverbLevel = ComputeDistanceAttenuation(
			normalizedDistance,
			(pEmitter->pReverbCurve != NULL) ?
				pEmitter->pReverbCurve :
				&reverbDefault
		);
	}

	/* For XACT, this calculates "DopplerPitchScalar" */
	if (Flags & F3DAUDIO_CALCULATE_DOPPLER)
	{
		CalculateDoppler(
			SPEEDOFSOUND(Instance),
			pListener,
			pEmitter,
			emitterToListener,
			eToLDistance,
			&pDSPSettings->ListenerVelocityComponent,
			&pDSPSettings->EmitterVelocityComponent,
			&pDSPSettings->DopplerFactor
		);
	}

	/* For XACT, this calculates "OrientationAngle" */
	if (Flags & F3DAUDIO_CALCULATE_EMITTER_ANGLE)
	{
		/* Determined roughly.
		 * Below that distance, the emitter angle is considered to be PI/2.
		 */
		#define EMITTER_ANGLE_NULL_DISTANCE 1.2e-7
		if (eToLDistance < EMITTER_ANGLE_NULL_DISTANCE)
		{
			pDSPSettings->EmitterToListenerAngle = F3DAUDIO_PI / 2.0f;
		}
		else
		{
			/* Note: pEmitter->OrientFront is normalized. */
			dp = VectorDot(emitterToListener, pEmitter->OrientFront) / eToLDistance;
			pDSPSettings->EmitterToListenerAngle = FAudio_acosf(dp);
		}
	}

	/* Unimplemented Flags */
	if (	(Flags & F3DAUDIO_CALCULATE_DELAY) &&
		SPEAKERMASK(Instance) == SPEAKER_STEREO	)
	{
		for (i = 0; i < pDSPSettings->DstChannelCount; i += 1)
		{
			pDSPSettings->pDelayTimes[i] = 0.0f;
		}
		FAudio_assert(0 && "DELAY not implemented!");
	}
}